

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O2

ON_SubDEdgePtr __thiscall ON_SubDVertex::CreasedEdge(ON_SubDVertex *this,bool bInteriorEdgesOnly)

{
  bool bVar1;
  ON__UINT_PTR OVar2;
  unsigned_short vei;
  ulong uVar3;
  ON_SubDEdge *this_00;
  
  OVar2 = 0;
  if (this->m_edges != (ON_SubDEdgePtr *)0x0) {
    for (uVar3 = 0; uVar3 < this->m_edge_count; uVar3 = uVar3 + 1) {
      this_00 = (ON_SubDEdge *)(this->m_edges[uVar3].m_ptr & 0xfffffffffffffff8);
      if ((this_00 != (ON_SubDEdge *)0x0) &&
         (((!bInteriorEdgesOnly ||
           (bVar1 = ON_SubDEdge::HasInteriorEdgeTopology(this_00,false), bVar1)) &&
          (this_00->m_edge_tag == Crease)))) {
        if (7 < OVar2) {
          return (ON_SubDEdgePtr)0;
        }
        OVar2 = this->m_edges[uVar3].m_ptr;
      }
    }
  }
  return (ON_SubDEdgePtr)OVar2;
}

Assistant:

const ON_SubDEdgePtr ON_SubDVertex::CreasedEdge(bool bInteriorEdgesOnly) const
{
  ON_SubDEdgePtr creased_eptr = ON_SubDEdgePtr::Null;
  if (nullptr != m_edges)
  {
    for (unsigned short vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_edges[vei].m_ptr);
      if (nullptr == e)
        continue;
      if (bInteriorEdgesOnly && false == e->HasInteriorEdgeTopology(false))
        continue;
      if (ON_SubDEdgeTag::Crease == e->m_edge_tag)
      {
        if (creased_eptr.IsNull())
          creased_eptr = m_edges[vei];
        else
          return ON_SubDEdgePtr::Null; // 2 or more creases.
      }
    }
  }
  return creased_eptr;
}